

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

uchar * voc_push_list_siz(voccxdef *ctx,uint lstsiz)

{
  anon_union_8_4_1dda36f5_for_runsv p;
  int in_ESI;
  long in_RDI;
  uchar *lstp;
  runsdef val;
  runcxdef *rcx;
  undefined4 in_stack_00000028;
  uint in_stack_00000038;
  uint in_stack_0000003c;
  runcxdef *in_stack_00000040;
  runsdef local_28;
  runcxdef *local_18;
  uint local_c;
  long local_8;
  
  local_18 = *(runcxdef **)(in_RDI + 0x10);
  local_c = in_ESI + 2;
  local_8 = in_RDI;
  if ((uint)((int)local_18->runcxhtop - (int)local_18->runcxhp) <= local_c) {
    runhcmp(in_stack_00000040,in_stack_0000003c,in_stack_00000038,(runsdef *)ctx,
            (runsdef *)CONCAT44(lstsiz,in_stack_00000028),(runsdef *)rcx);
  }
  local_28.runstyp = '\a';
  p = (anon_union_8_4_1dda36f5_for_runsv)
      ((anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 0x10) + 0x38))->runsvstr;
  local_28.runsv = p;
  oswp2(p.runsvstr,local_c);
  local_18->runcxhp = local_18->runcxhp + local_c;
  runrepush(local_18,&local_28);
  return (uchar *)(p.runsvnum + 2);
}

Assistant:

uchar *voc_push_list_siz(voccxdef *ctx, uint lstsiz)
{
    runcxdef *rcx = ctx->voccxrun;
    runsdef val;
    uchar *lstp;

    /* add in the size needed for the list's length prefix */
    lstsiz += 2;

    /* allocate space in the heap */
    runhres(rcx, lstsiz, 0);

    /* set up a stack value to push */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = lstp = ctx->voccxrun->runcxhp;

    /* set up the list's length prefix */
    oswp2(lstp, lstsiz);
    lstp += 2;

    /* commit the space in the heap */
    rcx->runcxhp += lstsiz;

    /* push the list value (repush, since we can use the original copy) */
    runrepush(rcx, &val);

    /* return the list element pointer */
    return lstp;
}